

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileFunction(jx9_gen_state *pGen)

{
  SyToken *pSVar1;
  sxu32 sVar2;
  SyToken *pSVar3;
  SyToken *ppFunc;
  sxi32 sVar4;
  
  pSVar3 = pGen->pIn;
  ppFunc = pGen->pEnd;
  sVar2 = pSVar3->nLine;
  pSVar1 = pSVar3 + 1;
  pGen->pIn = pSVar1;
  if ((pSVar1 < ppFunc) && ((pSVar3[1].nType & 0xc) != 0)) {
    sVar2 = pSVar3[1].nLine;
    pGen->pIn = pSVar3 + 2;
    if ((pSVar3 + 2 < ppFunc) && ((pSVar3[2].nType & 0x200) != 0)) {
      sVar4 = GenStateCompileFunc(pGen,&pSVar1->sData,0,(jx9_vm_func **)ppFunc);
      return sVar4;
    }
    sVar4 = jx9GenCompileError(pGen,1,sVar2,"Expected \'(\' after function name \'%z\'");
    if (sVar4 == -10) {
      return -10;
    }
    pSVar1 = pGen->pIn;
    while ((pSVar1 < pGen->pEnd && ((pSVar1->nType & 0x40040) == 0))) {
      pGen->pIn = pSVar1 + 1;
      pSVar1 = pSVar1 + 1;
    }
  }
  else {
    sVar4 = jx9GenCompileError(pGen,1,sVar2,"Invalid function name");
    if (sVar4 == -10) {
      return -10;
    }
    pSVar1 = pGen->pIn;
    while ((pSVar1 < pGen->pEnd && ((pSVar1->nType & 0x40040) == 0))) {
      pGen->pIn = pSVar1 + 1;
      pSVar1 = pSVar1 + 1;
    }
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileFunction(jx9_gen_state *pGen)
{
	SyString *pName;
	sxi32 iFlags;
	sxu32 nLine;
	sxi32 rc;

	nLine = pGen->pIn->nLine;
	pGen->pIn++; /* Jump the 'function' keyword */
	iFlags = 0;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid function name */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Invalid function name");
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		/* Sychronize with the next semi-colon or braces*/
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	pName = &pGen->pIn->sData;
	nLine = pGen->pIn->nLine;
	/* Jump the function name */
	pGen->pIn++;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after function name '%z'", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Sychronize with the next semi-colon or '{' */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Compile function body */
	rc = GenStateCompileFunc(&(*pGen),pName,iFlags,0);
	return rc;
}